

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int js_parse_expr_paren(JSParseState *s)

{
  int iVar1;
  int iVar2;
  
  iVar1 = js_parse_expect(s,0x28);
  iVar2 = -1;
  if (iVar1 == 0) {
    iVar1 = js_parse_expr2(s,1);
    if (iVar1 == 0) {
      iVar2 = js_parse_expect(s,0x29);
      iVar2 = -(uint)(iVar2 != 0);
    }
  }
  return iVar2;
}

Assistant:

static __exception int js_parse_expr_paren(JSParseState *s)
{
    if (js_parse_expect(s, '('))
        return -1;
    if (js_parse_expr(s))
        return -1;
    if (js_parse_expect(s, ')'))
        return -1;
    return 0;
}